

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

node_t_conflict type_qual(c2m_ctx_t c2m_ctx,int no_err_p)

{
  token_t ptVar1;
  node_t_conflict n;
  node_code_t nc;
  parse_ctx_t parse_ctx;
  undefined8 uVar2;
  char *pcVar3;
  pos_t p;
  
  ptVar1 = c2m_ctx->parse_ctx->curr_token;
  if (*(short *)ptVar1 == 0x11e) {
    pcVar3 = (ptVar1->pos).fname;
    uVar2._0_4_ = (ptVar1->pos).lno;
    uVar2._4_4_ = (ptVar1->pos).ln_pos;
    read_token(c2m_ctx);
    nc = N_CONST;
  }
  else {
    ptVar1 = c2m_ctx->parse_ctx->curr_token;
    if (*(short *)ptVar1 == 0x12e) {
      pcVar3 = (ptVar1->pos).fname;
      uVar2._0_4_ = (ptVar1->pos).lno;
      uVar2._4_4_ = (ptVar1->pos).ln_pos;
      read_token(c2m_ctx);
      nc = N_RESTRICT;
    }
    else {
      ptVar1 = c2m_ctx->parse_ctx->curr_token;
      if (*(short *)ptVar1 == 0x13b) {
        pcVar3 = (ptVar1->pos).fname;
        uVar2._0_4_ = (ptVar1->pos).lno;
        uVar2._4_4_ = (ptVar1->pos).ln_pos;
        read_token(c2m_ctx);
        nc = N_VOLATILE;
      }
      else {
        ptVar1 = c2m_ctx->parse_ctx->curr_token;
        if (*(short *)ptVar1 != 0x114) {
          if (c2m_ctx->parse_ctx->record_level != 0) {
            return &err_struct;
          }
          syntax_error(c2m_ctx,"a type qualifier");
          return &err_struct;
        }
        pcVar3 = (ptVar1->pos).fname;
        uVar2._0_4_ = (ptVar1->pos).lno;
        uVar2._4_4_ = (ptVar1->pos).ln_pos;
        read_token(c2m_ctx);
        nc = N_ATOMIC;
      }
    }
  }
  n = new_node(c2m_ctx,nc);
  p.lno = (int)uVar2;
  p.ln_pos = (int)((ulong)uVar2 >> 0x20);
  p.fname = pcVar3;
  add_pos(c2m_ctx,n,p);
  return n;
}

Assistant:

D (type_qual) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t r;
  pos_t pos;

  if (MP (T_CONST, pos)) {
    r = new_pos_node (c2m_ctx, N_CONST, pos);
  } else if (MP (T_RESTRICT, pos)) {
    r = new_pos_node (c2m_ctx, N_RESTRICT, pos);
  } else if (MP (T_VOLATILE, pos)) {
    r = new_pos_node (c2m_ctx, N_VOLATILE, pos);
  } else if (MP (T_ATOMIC, pos)) {
    r = new_pos_node (c2m_ctx, N_ATOMIC, pos);
  } else {
    if (record_level == 0) syntax_error (c2m_ctx, "a type qualifier");
    r = err_node;
  }
  return r;
}